

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
          (SourceLocationCommentPrinter *this,string *output)

{
  Nonnull<std::string_*> dest;
  long lVar1;
  string local_68;
  AlphaNum local_48;
  Nonnull<std::string_*> local_18;
  string *output_local;
  SourceLocationCommentPrinter *this_local;
  
  if ((this->have_source_loc_ & 1U) != 0) {
    local_18 = output;
    output_local = (string *)this;
    lVar1 = std::__cxx11::string::size();
    dest = local_18;
    if (lVar1 != 0) {
      FormatComment(&local_68,this,&(this->source_loc_).trailing_comments);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_48,&local_68);
      absl::lts_20250127::StrAppend(dest,&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return;
}

Assistant:

void AddPostComment(std::string* output) {
    if (have_source_loc_ && source_loc_.trailing_comments.size() > 0) {
      absl::StrAppend(output, FormatComment(source_loc_.trailing_comments));
    }
  }